

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int32_t __thiscall
aeron::archive::AeronArchive::findLastMatchingRecording
          (AeronArchive *this,int64_t minRecordingId,string *channelFragment,int32_t streamId,
          int32_t sessionId)

{
  int64_t iVar1;
  int32_t sessionId_local;
  int32_t streamId_local;
  int64_t minRecordingId_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  sessionId_local = sessionId;
  streamId_local = streamId;
  minRecordingId_local = minRecordingId;
  local_38._M_unused._M_object = operator_new(0x28);
  *(AeronArchive **)local_38._M_unused._0_8_ = this;
  *(int64_t **)((long)local_38._M_unused._0_8_ + 8) = &minRecordingId_local;
  *(string **)((long)local_38._M_unused._0_8_ + 0x10) = channelFragment;
  *(int32_t **)((long)local_38._M_unused._0_8_ + 0x18) = &streamId_local;
  *(int32_t **)((long)local_38._M_unused._0_8_ + 0x20) = &sessionId_local;
  pcStack_20 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:301:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:301:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse
                    (this,(function<bool_(long)> *)&local_38,"find last matching recording");
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::findLastMatchingRecording(std::int64_t minRecordingId, const std::string& channelFragment,
                                                     std::int32_t streamId, std::int32_t sessionId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->findLastMatchingRecording(minRecordingId, channelFragment, streamId, sessionId,
                                                                  correlationId, controlSessionId_);
        },
        "find last matching recording");
}